

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# read669.c
# Opt level: O0

int it_669_read_pattern(IT_PATTERN *pattern,DUMBFILE *f,int tempo,int breakpoint,uchar *buffer,
                       int *used_channels)

{
  undefined1 *puVar1;
  int32 iVar2;
  void *pvVar3;
  int in_ECX;
  undefined1 in_DL;
  undefined4 *in_RDI;
  long in_R8;
  int *in_R9;
  IT_ENTRY *entry;
  int row;
  int channel;
  int pos;
  DUMBFILE *in_stack_ffffffffffffffb8;
  undefined1 *puVar4;
  int32 in_stack_ffffffffffffffc4;
  int iVar5;
  undefined4 in_stack_ffffffffffffffc8;
  int iVar6;
  undefined4 in_stack_ffffffffffffffcc;
  int iVar7;
  int local_20;
  int local_4;
  
  *in_RDI = 0x40;
  iVar2 = dumbfile_getnc((char *)CONCAT44(in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8),
                         in_stack_ffffffffffffffc4,in_stack_ffffffffffffffb8);
  if (iVar2 < 0x600) {
    local_4 = -1;
  }
  else {
    in_RDI[1] = 0x41;
    if (in_ECX < 0x3f) {
      in_RDI[1] = in_RDI[1] + 1;
    }
    iVar7 = 0;
    for (iVar5 = 0; iVar5 < 0x40; iVar5 = iVar5 + 1) {
      for (iVar6 = 0; iVar6 < 8; iVar6 = iVar6 + 1) {
        if ((*(char *)(in_R8 + iVar7) != -1) || (*(char *)(in_R8 + (iVar7 + 2)) != -1)) {
          in_RDI[1] = in_RDI[1] + 1;
        }
        iVar7 = iVar7 + 3;
      }
    }
    pvVar3 = malloc((long)(int)in_RDI[1] * 7);
    *(void **)(in_RDI + 2) = pvVar3;
    if (*(long *)(in_RDI + 2) == 0) {
      local_4 = -1;
    }
    else {
      local_20 = in_ECX;
      if (in_ECX == 0x3f) {
        local_20 = 0x40;
      }
      puVar1 = *(undefined1 **)(in_RDI + 2);
      *puVar1 = 8;
      puVar1[1] = 8;
      puVar1[5] = 1;
      puVar1[6] = in_DL;
      iVar7 = 0;
      for (iVar5 = 0; puVar4 = puVar1 + 7, iVar5 < 0x40; iVar5 = iVar5 + 1) {
        if (iVar5 == local_20) {
          *puVar4 = 8;
          puVar1[8] = 8;
          puVar1[0xc] = 3;
          puVar1[0xd] = 0;
          puVar4 = puVar1 + 0xe;
        }
        for (iVar6 = 0; iVar6 < 8; iVar6 = iVar6 + 1) {
          if ((*(char *)(in_R8 + iVar7) != -1) || (*(char *)(in_R8 + (iVar7 + 2)) != -1)) {
            *puVar4 = (char)iVar6;
            puVar4[1] = 0;
            if (*(byte *)(in_R8 + iVar7) < 0xfe) {
              puVar4[1] = puVar4[1] | 3;
              puVar4[2] = (char)((int)(uint)*(byte *)(in_R8 + iVar7) >> 2) + '$';
              puVar4[3] = ((*(byte *)(in_R8 + iVar7) & 3) << 4 |
                          (byte)((int)(uint)*(byte *)(in_R8 + (iVar7 + 1)) >> 4)) + 1;
            }
            if (*(char *)(in_R8 + iVar7) != -1) {
              puVar4[1] = puVar4[1] | 4;
              puVar4[4] = (char)((ulong)(long)(int)((*(byte *)(in_R8 + (iVar7 + 1)) & 0xf) << 6) /
                                0xf);
              if (*in_R9 < iVar6 + 1) {
                *in_R9 = iVar6 + 1;
              }
            }
            if (*(char *)(in_R8 + (iVar7 + 2)) != -1) {
              puVar4[1] = puVar4[1] | 8;
              puVar4[6] = *(byte *)((long)iVar7 + 2 + in_R8) & 0xf;
              switch(*(byte *)((long)iVar7 + 2 + in_R8) >> 4) {
              case 0:
                puVar4[5] = 6;
                break;
              case 1:
                puVar4[5] = 5;
                break;
              case 2:
                puVar4[5] = 7;
                break;
              case 3:
                puVar4[5] = 0x13;
                puVar4[6] = puVar4[6] + '(';
                break;
              case 4:
                puVar4[5] = 8;
                puVar4[6] = puVar4[6] | 0x10;
                break;
              case 5:
                if (puVar4[6] == '\0') {
                  puVar4[1] = puVar4[1] & 0xf7;
                }
                else {
                  puVar4[5] = 1;
                }
                break;
              default:
                puVar4[1] = puVar4[1] & 0xf7;
              }
              if (*in_R9 < iVar6 + 1) {
                *in_R9 = iVar6 + 1;
              }
            }
            puVar4 = puVar4 + 7;
          }
          iVar7 = iVar7 + 3;
        }
        *puVar4 = 0xff;
        puVar1 = puVar4;
      }
      local_4 = 0;
    }
  }
  return local_4;
}

Assistant:

static int it_669_read_pattern(IT_PATTERN *pattern, DUMBFILE *f, int tempo, int breakpoint, unsigned char *buffer, int * used_channels)
{
	int pos;
	int channel;
	int row;
	IT_ENTRY *entry;

	pattern->n_rows = 64;

    if (dumbfile_getnc((char *)buffer, 64 * 3 * 8, f) < 64 * 3 * 8)
		return -1;

	/* compute number of entries */
	pattern->n_entries = 64 + 1; /* Account for the row end markers, speed command */
	if (breakpoint < 63) pattern->n_entries++; /* and break to row 0 */

	pos = 0;
	for (row = 0; row < 64; row++) {
		for (channel = 0; channel < 8; channel++) {
			if (buffer[pos+0] != 0xFF || buffer[pos+2] != 0xFF)
				pattern->n_entries++;
			pos += 3;
		}
	}

	pattern->entry = malloc(pattern->n_entries * sizeof(*pattern->entry));
	if (!pattern->entry)
		return -1;

	if (breakpoint == 63) breakpoint++;

	entry = pattern->entry;

	entry->channel = 8;
	entry->mask = IT_ENTRY_EFFECT;
	entry->effect = IT_SET_SPEED;
	entry->effectvalue = tempo;
	entry++;

	pos = 0;
	for (row = 0; row < 64; row++) {

		if (row == breakpoint) {
			entry->channel = 8;
			entry->mask = IT_ENTRY_EFFECT;
			entry->effect = IT_BREAK_TO_ROW;
			entry->effectvalue = 0;
			entry++;
		}

		for (channel = 0; channel < 8; channel++) {
			if (buffer[pos+0] != 0xFF || buffer[pos+2] != 0xFF) {
				entry->channel = channel;
				entry->mask = 0;

				if (buffer[pos+0] < 0xFE) {
					entry->mask |= IT_ENTRY_NOTE | IT_ENTRY_INSTRUMENT;
					entry->note = (buffer[pos+0] >> 2) + 36;
					entry->instrument = (((buffer[pos+0] << 4) | (buffer[pos+1] >> 4)) & 0x3F) + 1;
				}
				if (buffer[pos+0] <= 0xFE) {
					entry->mask |= IT_ENTRY_VOLPAN;
					entry->volpan = ((buffer[pos+1] & 15) << 6) / 15;
					if (*used_channels < channel + 1) *used_channels = channel + 1;
				}
				if (buffer[pos+2] != 0xFF) {
					entry->mask |= IT_ENTRY_EFFECT;
					entry->effectvalue = buffer[pos+2] & 15;
					switch (buffer[pos+2] >> 4) {
						case 0:
							entry->effect = IT_PORTAMENTO_UP;
							break;
						case 1:
							entry->effect = IT_PORTAMENTO_DOWN;
							break;
						case 2:
							entry->effect = IT_TONE_PORTAMENTO;
							break;
						case 3:
							entry->effect = IT_S;
							entry->effectvalue += IT_S_FINETUNE * 16 + 8;
							break;
						case 4:
							entry->effect = IT_VIBRATO;
							// XXX speed unknown
							entry->effectvalue |= 0x10;
							break;
						case 5:
							if (entry->effectvalue) {
								entry->effect = IT_SET_SPEED;
							} else {
								entry->mask &= ~IT_ENTRY_EFFECT;
							}
							break;
#if 0
						/* dunno about this, really... */
						case 6:
							if (entry->effectvalue == 0) {
								entry->effect = IT_PANNING_SLIDE;
								entry->effectvalue = 0xFE;
							} else if (entry->effectvalue == 1) {
								entry->effect = IT_PANNING_SLIDE;
								entry->effectvalue = 0xEF;
							} else {
								entry->mask &= ~IT_ENTRY_EFFECT;
							}
							break;
#endif
						default:
							entry->mask &= ~IT_ENTRY_EFFECT;
							break;
					}
					if (*used_channels < channel + 1) *used_channels = channel + 1;
				}

				entry++;
			}
			pos += 3;
		}
		IT_SET_END_ROW(entry);
		entry++;
	}

	return 0;
}